

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_CollapseIrredundantFull(Vec_Str_t *vSop,int nCubes,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  sat_solver *s;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  void *Entry;
  int iVar9;
  char *Entry_00;
  int iVar10;
  ulong uVar11;
  
  p = Vec_IntAlloc(nVars + nCubes);
  Entry_00 = vSop->pArray;
  p_00 = Vec_PtrAlloc(nCubes);
  uVar7 = nVars + 3;
  if (vSop->nSize != uVar7 * nCubes + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x11c,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
  }
  for (; *Entry_00 != '\0'; Entry_00 = Entry_00 + (int)uVar7) {
    Vec_PtrPush(p_00,Entry_00);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nVars + nCubes);
  iVar8 = p_00->nSize;
  iVar9 = 0;
  uVar6 = 0;
  if (0 < nVars) {
    uVar6 = (ulong)(uint)nVars;
  }
  iVar1 = 0;
  if (0 < iVar8) {
    iVar1 = iVar8;
  }
  while (iVar9 != iVar1) {
    pvVar4 = Vec_PtrEntry(p_00,iVar9);
    iVar2 = Abc_Var2Lit(iVar9 + nVars,1);
    Vec_IntGrow(p,1);
    *p->pArray = iVar2;
    p->nSize = 1;
    for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      if (*(char *)((long)pvVar4 + uVar11) != '-') {
        iVar2 = Abc_Var2Lit((int)uVar11,(uint)(*(char *)((long)pvVar4 + uVar11) == '0'));
        Vec_IntPush(p,iVar2);
      }
    }
    iVar2 = sat_solver_addclause(s,p->pArray,p->pArray + p->nSize);
    iVar9 = iVar9 + 1;
    if (iVar2 != 1) {
      __assert_fail("status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,300,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
    }
  }
  iVar9 = 0;
  if (nCubes < 1) {
    nCubes = 0;
  }
  iVar2 = 0;
  do {
    iVar10 = iVar1;
    if (iVar2 == iVar1) {
LAB_0048eb91:
      if (0 < iVar9 && iVar10 == iVar8) {
        uVar11 = 0;
        uVar6 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar6 = uVar11;
        }
        iVar8 = 0;
        while (iVar9 = (int)uVar11, iVar9 != iVar1) {
          pvVar4 = Vec_PtrEntry(p_00,iVar9);
          if (pvVar4 != (void *)0x0) {
            for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
              Vec_StrWriteEntry(vSop,(int)uVar11 + iVar8,*(char *)((long)pvVar4 + uVar11));
            }
            iVar8 = iVar8 + (int)uVar11;
          }
          uVar11 = (ulong)(iVar9 + 1);
        }
        Vec_StrWriteEntry(vSop,iVar8,'\0');
        Vec_StrShrink(vSop,iVar8 + 1);
      }
      sat_solver_delete(s);
      Vec_PtrFree(p_00);
      Vec_IntFree(p);
      return 0;
    }
    pvVar4 = Vec_PtrEntry(p_00,iVar2);
    p->nSize = 0;
    for (iVar10 = 0; nCubes != iVar10; iVar10 = iVar10 + 1) {
      if ((iVar2 != iVar10) && (pvVar5 = Vec_PtrEntry(p_00,iVar10), pvVar5 != (void *)0x0)) {
        iVar3 = Abc_Var2Lit(nVars + iVar10,0);
        Vec_IntPush(p,iVar3);
      }
    }
    for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      if (*(char *)((long)pvVar4 + uVar11) != '-') {
        iVar10 = Abc_Var2Lit((int)uVar11,(uint)(*(char *)((long)pvVar4 + uVar11) == '1'));
        Vec_IntPush(p,iVar10);
      }
    }
    iVar3 = sat_solver_solve(s,p->pArray,p->pArray + p->nSize,0,0,0,0);
    if (iVar3 == -1) {
      Vec_PtrWriteEntry(p_00,iVar2,Entry);
      iVar9 = iVar9 + 1;
    }
    else if (iVar3 != 1) {
      iVar10 = iVar2;
      if (iVar3 != 0) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                      ,0x145,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
      }
      goto LAB_0048eb91;
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int Bmc_CollapseIrredundantFull( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars+nCubes);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars + nCubes );
    // add cubes
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(nVars + i, 1) ); // neg literal
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '0') );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through cubes in the direct order
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && Vec_PtrEntry(vCubes, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(nVars + k, 0) ); // pos literal
        // collect cube
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == Vec_PtrSize(vCubes) && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}